

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  uint uVar2;
  internal_state_conflict *piVar3;
  code *pcVar4;
  _func_int_aec_stream_ptr_conflict **pp_Var5;
  ulong uVar6;
  uint32_t *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint32_t uVar16;
  
  uVar1 = strm->bits_per_sample;
  iVar14 = -1;
  if (0xffffffdf < uVar1 - 0x21) {
    iVar14 = 1;
    piVar3 = (internal_state_conflict *)calloc(1,0x350);
    if (piVar3 != (internal_state_conflict *)0x0) {
      iVar8 = 0;
      iVar11 = 0;
      do {
        lVar13 = 0;
        do {
          piVar3->se_table[(long)iVar8 * 2 + lVar13 * 2] = iVar11;
          piVar3->se_table[(long)iVar8 * 2 + lVar13 * 2 + 1] = iVar8;
          lVar13 = lVar13 + 1;
        } while (iVar14 != (int)lVar13);
        iVar8 = iVar8 + iVar14;
        iVar11 = iVar11 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar11 != 0xd);
      strm->state = piVar3;
      if (uVar1 < 0x11) {
        if (uVar1 < 9) {
          uVar15 = strm->flags;
          if ((uVar15 & 0x10) == 0) {
            piVar3->id_len = 3;
            uVar12 = 3;
          }
          else {
            if (4 < uVar1) {
              return -1;
            }
            if (uVar1 < 3) {
              piVar3->id_len = 1;
              uVar12 = 1;
            }
            else {
              piVar3->id_len = 2;
              uVar12 = 2;
            }
          }
          piVar3->bytes_per_sample = 1;
          uVar16 = strm->block_size;
          piVar3->out_blklen = uVar16;
          piVar3->flush_output = flush_8;
        }
        else {
          piVar3->bytes_per_sample = 2;
          piVar3->id_len = 4;
          uVar16 = strm->block_size;
          piVar3->out_blklen = uVar16 * 2;
          uVar15 = strm->flags;
          if ((uVar15 & 4) == 0) {
            pcVar4 = flush_lsb_16;
          }
          else {
            pcVar4 = flush_msb_16;
          }
          piVar3->flush_output = pcVar4;
          uVar12 = 4;
        }
      }
      else {
        piVar3->id_len = 5;
        uVar15 = strm->flags;
        if ((uVar15 & 2) == 0 || 0x18 < uVar1) {
          piVar3->bytes_per_sample = 4;
          pcVar4 = flush_msb_32;
          if ((uVar15 & 4) == 0) {
            pcVar4 = flush_lsb_32;
          }
          iVar14 = 4;
        }
        else {
          piVar3->bytes_per_sample = 3;
          pcVar4 = flush_msb_24;
          if ((uVar15 & 4) == 0) {
            pcVar4 = flush_lsb_24;
          }
          iVar14 = 3;
        }
        piVar3->flush_output = pcVar4;
        uVar16 = strm->block_size;
        piVar3->out_blklen = iVar14 * uVar16;
        uVar12 = 5;
      }
      if ((uVar15 & 1) == 0) {
        uVar2 = 0xffffffff >> (-(char)uVar1 & 0x1fU);
        uVar9 = 0;
      }
      else {
        uVar2 = 0xffffffff >> (0x21U - (char)uVar1 & 0x1f);
        uVar9 = ~uVar2;
      }
      piVar3->xmin = uVar9;
      piVar3->xmax = uVar2;
      piVar3->in_blklen = (uVar1 * uVar16 + uVar12 >> 3) + 0x10;
      pp_Var5 = (_func_int_aec_stream_ptr_conflict **)
                malloc((ulong)(0x100000000 << (sbyte)uVar12) >> 0x1d);
      piVar3->id_table = pp_Var5;
      if (pp_Var5 != (_func_int_aec_stream_ptr_conflict **)0x0) {
        *pp_Var5 = m_low_entropy;
        uVar10 = (ulong)((1 << (sbyte)uVar12) - 1);
        if (1 < uVar12) {
          uVar6 = 1;
          do {
            piVar3->id_table[uVar6] = m_split;
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
          pp_Var5 = piVar3->id_table;
        }
        pp_Var5[uVar10] = m_uncomp;
        uVar10 = (ulong)(strm->rsi * uVar16);
        piVar3->rsi_size = uVar10;
        puVar7 = (uint32_t *)malloc(uVar10 << 2);
        piVar3->rsi_buffer = puVar7;
        if (puVar7 == (uint32_t *)0x0) {
          return -4;
        }
        uVar15 = uVar15 & 8;
        piVar3->pp = uVar15;
        piVar3->ref = uVar15 >> 3;
        piVar3->encoded_block_size = uVar16 + ((int)(uVar15 << 0x1c) >> 0x1f);
        strm->total_in = 0;
        strm->total_out = 0;
        piVar3->rsip = puVar7;
        piVar3->flush_start = puVar7;
        piVar3->bitp = 0;
        piVar3->fs = 0;
        piVar3->mode = m_id;
        return 0;
      }
    }
    iVar14 = -4;
  }
  return iVar14;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    int modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    return AEC_OK;
}